

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

int main(int argc,char **argv)

{
  rx_test_case *test_case;
  rx__test_case_desc *prVar1;
  long lVar2;
  int iVar3;
  rx_status rVar4;
  rx__test_case_desc **c_it;
  rx__test_case_desc **pprVar5;
  void *__base;
  void *__ptr;
  undefined8 *puVar6;
  char *fmt;
  rx_test_case *prVar7;
  rx_test_case *prVar8;
  int *piVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  rx__test_suite_desc **pprVar13;
  rx_summary *summary;
  uint uVar14;
  rx_test_case *__nmemb;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  rx_test_case *local_58;
  rx__test_case_config_blueprint local_48;
  rx_run_fn local_38;
  
  pprVar5 = &rx__dummy_case;
  __nmemb = (rx_test_case *)0x0;
  do {
    __nmemb = (rx_test_case *)
              ((long)&__nmemb->suite_name + (ulong)(*pprVar5 != (rx__test_case_desc *)0x0));
    pprVar5 = pprVar5 + 1;
  } while (pprVar5 != (rx__test_case_desc **)&__stop_rxcase);
  if (__nmemb == (rx_test_case *)0x0) {
    rx__log(RX_LOG_LEVEL_INFO,(char *)argv,0x148f,"nothing to run\n");
    return 0;
  }
  __base = malloc((size_t)((long)__nmemb * 0x38));
  if (__base == (void *)0x0) {
    rx__log(RX_LOG_LEVEL_ERROR,(char *)argv,0x14ed,"failed to allocate the test cases\n");
    return 1;
  }
  pprVar5 = &rx__dummy_case;
  local_58 = (rx_test_case *)0x0;
  local_38 = (rx_run_fn)((long)__nmemb * 0x38);
  do {
    prVar1 = *pprVar5;
    if (prVar1 != (rx__test_case_desc *)0x0) {
      pprVar13 = &rx__dummy_suite;
      do {
        puVar6 = &(*pprVar13)->name;
        if ((puVar6 != (undefined8 *)0x0) &&
           (iVar3 = strcmp((char *)*puVar6,prVar1->suite_name), iVar3 == 0)) {
          local_48._0_8_ = (char *)0x0;
          local_48.fixture = (rx__fixture_desc *)0x0;
          if ((undefined8 *)puVar6[1] != (undefined8 *)0x0) {
            (**(code **)puVar6[1])(&local_48);
          }
          goto LAB_00102564;
        }
        pprVar13 = (rx__test_suite_desc **)((long)pprVar13 + 8);
      } while ((eh_frame_hdr *)pprVar13 != &__stop_rxsuite);
      local_48._0_8_ = (char *)0x0;
      local_48.fixture = (rx__fixture_desc *)0x0;
LAB_00102564:
      if (prVar1->config_desc != (rx__test_case_config_desc *)0x0) {
        (*prVar1->config_desc->update)(&local_48);
      }
      lVar10 = (long)local_58 * 0x38;
      *(char **)((long)__base + lVar10) = prVar1->suite_name;
      *(char **)((long)__base + lVar10 + 8) = prVar1->name;
      *(rx_run_fn *)((long)__base + lVar10 + 0x10) = prVar1->run;
      *(int *)((long)__base + lVar10 + 0x18) = local_48.skip;
      puVar6 = (undefined8 *)((long)__base + lVar10 + 0x20);
      *puVar6 = 0;
      puVar6[1] = 0;
      *(undefined8 *)((long)__base + lVar10 + 0x30) = 0;
      if (local_48.fixture != (rx__fixture_desc *)0x0) {
        *(rx_size *)((long)__base + lVar10 + 0x20) = (local_48.fixture)->size;
        if ((local_48.fixture)->update != (rx__fixture_config_update_fn)0x0) {
          (*(local_48.fixture)->update)((rx_fixture_config *)((long)__base + lVar10 + 0x28));
        }
      }
      local_58 = (rx_test_case *)((long)&local_58->suite_name + 1);
    }
    pprVar5 = pprVar5 + 1;
  } while (pprVar5 != (rx__test_case_desc **)&__stop_rxcase);
  if (local_58 != __nmemb) {
    __assert_fail("i == *test_case_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1a06,"void rx_enumerate_test_cases(rx_size *, struct rx_test_case *)");
  }
  prVar8 = __nmemb;
  qsort(__base,(size_t)__nmemb,0x38,rx__compare_test_cases);
  __ptr = malloc((size_t)local_38);
  if (__ptr == (void *)0x0) {
    rx__log(RX_LOG_LEVEL_ALL,(char *)prVar8,0x1498,"failed to allocate the summaries\n");
    uVar14 = 1;
  }
  else {
    prVar7 = (rx_test_case *)0x0;
    do {
      lVar10 = (long)prVar7 * 0x38;
      if (*(long *)((long)__base + lVar10) == 0) {
        __assert_fail("test_case->suite_name != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x14a5,
                      "enum rx_status rx__run_test_cases(size_t, const struct rx_test_case *)");
      }
      test_case = (rx_test_case *)((long)__base + lVar10);
      if (test_case->name == (char *)0x0) {
        __assert_fail("test_case->name != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x14a6,
                      "enum rx_status rx__run_test_cases(size_t, const struct rx_test_case *)");
      }
      summary = (rx_summary *)(lVar10 + (long)__ptr);
      summary->failure_count = 0;
      summary->failures = (rx_failure *)0x0;
      summary->error = (char *)0x0;
      summary->assessed_count = 0;
      summary->test_case = (rx_test_case *)0x0;
      *(undefined8 *)&summary->skipped = 0;
      summary->elapsed = 0;
      puVar6 = (undefined8 *)malloc(0x30);
      if (puVar6 == (undefined8 *)0x0) {
        rx__log(RX_LOG_LEVEL_ALL,(char *)prVar8,0x120e,
                "failed to reserve a large enough capacity for the test failure array (requested capacity: %lu)\n"
               );
        rVar4 = RX_ERROR_ALLOCATION;
        rx__log(RX_LOG_LEVEL_ERROR,(char *)prVar8,0x18d0,
                "failed to create the test failure array (suite: \"%s\", case: \"%s\")\n",
                test_case->suite_name,test_case->name);
      }
      else {
        *puVar6 = 0;
        puVar6[1] = 1;
        summary->failures = (rx_failure *)(puVar6 + 2);
        summary->test_case = test_case;
        rVar4 = RX_SUCCESS;
      }
      if (rVar4 == RX_SUCCESS) {
        prVar7 = (rx_test_case *)((long)&prVar7->suite_name + 1);
        prVar8 = test_case;
        rVar4 = rx_test_case_run(summary,test_case);
        if (rVar4 != RX_SUCCESS) {
          pcVar11 = test_case->suite_name;
          pcVar12 = test_case->name;
          iVar3 = 0x14b8;
          fmt = "failed to run a test case (suite: \"%s\", case: \"%s\")\n";
          goto LAB_0010273a;
        }
        prVar8 = summary->test_case;
        if (prVar8 == (rx_test_case *)0x0) {
          __assert_fail("summary->test_case != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                        ,0x18f6,"void rx_summary_print(const struct rx_summary *)");
        }
        if (prVar8->suite_name == (char *)0x0) {
          __assert_fail("summary->test_case->suite_name != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                        ,0x18f7,"void rx_summary_print(const struct rx_summary *)");
        }
        if (prVar8->name == (char *)0x0) {
          __assert_fail("summary->test_case->name != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                        ,0x18f8,"void rx_summary_print(const struct rx_summary *)");
        }
        if (summary->failures == (rx_failure *)0x0) {
          __assert_fail("summary->failures != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                        ,0x18f9,"void rx_summary_print(const struct rx_summary *)");
        }
        prVar8 = (rx_test_case *)&local_48;
        main_cold_1();
        iVar3 = 0;
        rVar4 = RX_SUCCESS;
      }
      else {
        pcVar11 = test_case->suite_name;
        pcVar12 = test_case->name;
        iVar3 = 0x14ad;
        fmt = "failed to initialize the summary (suite: \"%s\", case: \"%s\")\n";
LAB_0010273a:
        rx__log(RX_LOG_LEVEL_ERROR,(char *)prVar8,iVar3,fmt,pcVar11,pcVar12);
        iVar3 = 10;
      }
      if (iVar3 != 0) {
        if (iVar3 == 10) goto joined_r0x00102822;
        uVar14 = 0;
        goto LAB_001028a5;
      }
    } while (prVar7 < __nmemb);
    if (rVar4 == RX_SUCCESS) {
      prVar8 = (rx_test_case *)0x0;
      rVar4 = RX_SUCCESS;
      do {
        lVar10 = *(long *)((long)__ptr + (long)prVar8 * 0x38 + 0x20);
        if (lVar10 != 0) {
          piVar9 = (int *)(*(long *)((long)__ptr + (long)prVar8 * 0x38 + 0x28) + 0xc);
          do {
            bVar17 = *piVar9 != 1;
            if (!bVar17) {
              rVar4 = RX_ERROR_ABORTED;
              iVar3 = 10;
              goto LAB_00102905;
            }
            piVar9 = piVar9 + 8;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        bVar17 = true;
        iVar3 = 0;
LAB_00102905:
        if (!bVar17) goto LAB_00102914;
        prVar8 = (rx_test_case *)((long)&prVar8->suite_name + 1);
      } while (prVar8 != __nmemb);
      iVar3 = 0;
LAB_00102914:
      if ((iVar3 != 0) && (uVar14 = 0, iVar3 != 10)) goto LAB_001028a5;
    }
joined_r0x00102822:
    while (prVar7 != (rx_test_case *)0x0) {
      prVar7 = (rx_test_case *)((long)&prVar7[-1].config.fixture.config.tear_down + 7);
      lVar10 = (long)prVar7 * 0x38;
      if (*(long *)((long)__ptr + lVar10 + 0x28) == 0) {
        __assert_fail("summary->failures != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                      ,0x18de,"void rx_summary_terminate(struct rx_summary *)");
      }
      if (*(long *)((long)__ptr + lVar10 + 0x20) != 0) {
        lVar15 = 0x18;
        uVar16 = 0;
        do {
          lVar2 = *(long *)((long)__ptr + lVar10 + 0x28);
          free(*(void **)(lVar2 + -0x18 + lVar15));
          free(*(void **)(lVar2 + -8 + lVar15));
          free(*(void **)(lVar2 + lVar15));
          uVar16 = uVar16 + 1;
          lVar15 = lVar15 + 0x20;
        } while (uVar16 < *(ulong *)((long)__ptr + lVar10 + 0x20));
      }
      free((void *)(*(long *)((long)__ptr + lVar10 + 0x28) + -0x10));
    }
    free(__ptr);
    uVar14 = (uint)(rVar4 != RX_SUCCESS);
  }
LAB_001028a5:
  free(__base);
  return uVar14;
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    return rx_main(0, NULL, argc, argv) == RX_SUCCESS ? 0 : 1;
}